

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::createIdentity(Matrix *this,int size)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  Matrix MVar7;
  
  Matrix(this,size,size);
  ppdVar1 = this->p;
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar3 = uVar4;
  }
  uVar2 = (ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      uVar6 = 0x3ff00000;
      if (uVar4 != uVar5) {
        uVar6 = 0;
      }
      ppdVar1[uVar4][uVar5] = (double)((ulong)uVar6 << 0x20);
    }
  }
  MVar7.p = ppdVar1;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Matrix Matrix::createIdentity(int size)
{
    Matrix temp(size, size);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            if (i == j) {
                temp.p[i][j] = 1;
            } else {
                temp.p[i][j] = 0;
            }
        }
    }
    return temp;
}